

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TType * __thiscall
glslang::HlslParseContext::split
          (HlslParseContext *this,TType *type,TString *name,TQualifier *outerQualifier)

{
  TType *type_00;
  int iVar1;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  undefined4 extraout_var;
  iterator __position;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  iVar1 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar1 != '\0') {
    this_00 = &TType::getWritableStruct(type)->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    __position._M_current =
         (this_00->
         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)._M_impl
         .super__Vector_impl_data._M_start;
    while (__position._M_current !=
           (this_00->
           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
           _M_impl.super__Vector_impl_data._M_finish) {
      iVar1 = (*(__position._M_current)->type->_vptr_TType[0x29])();
      type_00 = (__position._M_current)->type;
      if ((char)iVar1 == '\0') {
        std::operator+(&local_80,name,".");
        iVar1 = (*(__position._M_current)->type->_vptr_TType[6])();
        std::operator+(&local_58,&local_80,
                       (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )CONCAT44(extraout_var_00,iVar1));
        split(this,type_00,&local_58,outerQualifier);
        __position._M_current = __position._M_current + 1;
      }
      else {
        iVar1 = (*type->_vptr_TType[0x13])();
        splitBuiltIn(this,name,type_00,(TArraySizes *)CONCAT44(extraout_var,iVar1),outerQualifier);
        __position = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                     erase(this_00,__position._M_current);
      }
    }
  }
  return type;
}

Assistant:

const TType& HlslParseContext::split(const TType& type, const TString& name, const TQualifier& outerQualifier)
{
    if (type.isStruct()) {
        TTypeList* userStructure = type.getWritableStruct();
        for (auto ioType = userStructure->begin(); ioType != userStructure->end(); ) {
            if (ioType->type->isBuiltIn()) {
                // move out the built-in
                splitBuiltIn(name, *ioType->type, type.getArraySizes(), outerQualifier);
                ioType = userStructure->erase(ioType);
            } else {
                split(*ioType->type, name + "." + ioType->type->getFieldName(), outerQualifier);
                ++ioType;
            }
        }
    }

    return type;
}